

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTargetInternals::cmTargetInternals(cmTargetInternals *this)

{
  _Rb_tree_header *p_Var1;
  Snapshot local_30;
  
  cmState::Snapshot::Snapshot(&local_30,(cmState *)0x0,(PositionType)ZEXT816(0));
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backtrace).Snapshot.State = local_30.State;
  (this->Backtrace).Snapshot.Position.Tree = local_30.Position.Tree;
  (this->Backtrace).Snapshot.Position.Position = local_30.Position.Position;
  p_Var1 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityItems)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->PolicyWarnedCMP0022 = false;
  this->UtilityItemsDone = false;
  memset(&this->IncludeDirectoriesEntries,0,0x90);
  return;
}

Assistant:

cmTargetInternals()
    : Backtrace()
    {
    this->PolicyWarnedCMP0022 = false;
    this->UtilityItemsDone = false;
    }